

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O2

void __thiscall flatbuffers::EnumDef::EnumDef(EnumDef *this)

{
  _Rb_tree_header *p_Var1;
  
  Definition::Definition(&this->super_Definition);
  this->is_union = false;
  this->uses_multiple_type_instances = false;
  (this->vals).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->vals).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->vals).dict._M_t._M_impl.super__Rb_tree_header;
  (this->underlying_type).base_type = BASE_TYPE_NONE;
  (this->underlying_type).element = BASE_TYPE_NONE;
  (this->underlying_type).struct_def = (StructDef *)0x0;
  *(undefined8 *)((long)&(this->underlying_type).struct_def + 2) = 0;
  *(undefined8 *)((long)&(this->underlying_type).enum_def + 2) = 0;
  (this->vals).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->vals).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->vals).dict._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->vals).vec.
  super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vals).vec.
  super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vals).vec.
  super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

EnumDef() : is_union(false), uses_multiple_type_instances(false) {}